

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

interpolator * interp_create(uint taps,uint factor,uint channels)

{
  uint uVar1;
  ulong __nmemb;
  interpolator *__ptr;
  interp_filter *__ptr_00;
  void *pvVar2;
  void *pvVar3;
  float **__ptr_01;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong __nmemb_00;
  double dVar9;
  double dVar10;
  double dVar11;
  
  __nmemb_00 = (ulong)taps;
  __ptr = (interpolator *)calloc(1,0x28);
  if (__ptr != (interpolator *)0x0) {
    __ptr->taps = 0x31;
    __ptr->factor = taps;
    __ptr->channels = factor;
    uVar7 = (ulong)(taps + 0x30) / (ulong)taps;
    __ptr->delay = (uint)uVar7;
    __ptr_00 = (interp_filter *)calloc(__nmemb_00,0x18);
    __ptr->filter = __ptr_00;
    if (__ptr_00 != (interp_filter *)0x0) {
      lVar8 = 0;
      while (__nmemb_00 * 0x18 + 0x18 != lVar8 + 0x18) {
        pvVar2 = calloc(uVar7,4);
        *(void **)((long)&__ptr_00->index + lVar8) = pvVar2;
        pvVar3 = calloc(uVar7,8);
        *(void **)((long)&__ptr_00->coeff + lVar8) = pvVar3;
        if ((pvVar2 == (void *)0x0) || (lVar8 = lVar8 + 0x18, pvVar3 == (void *)0x0))
        goto LAB_00107a76;
      }
      __nmemb = (ulong)factor;
      __ptr_01 = (float **)calloc(__nmemb,8);
      __ptr->z = __ptr_01;
      if (__ptr_01 != (float **)0x0) {
        uVar6 = 0;
        do {
          if (__nmemb == uVar6) {
            dVar10 = 0.0;
            for (uVar5 = 0; uVar5 != 0x31; uVar5 = uVar5 + 1) {
              dVar9 = 1.0;
              if (1e-06 < ABS((double)(int)(uVar5 - 0x18))) {
                dVar11 = ((double)(int)(uVar5 - 0x18) * 3.141592653589793) / (double)__nmemb_00;
                dVar9 = sin(dVar11);
                dVar9 = dVar9 / dVar11;
              }
              dVar11 = cos((dVar10 * 6.283185307179586) / 48.0);
              dVar9 = (1.0 - dVar11) * 0.5 * dVar9;
              if (1e-06 < ABS(dVar9)) {
                uVar7 = (ulong)uVar5 % __nmemb_00;
                uVar1 = __ptr_00[uVar7].count;
                __ptr_00[uVar7].count = uVar1 + 1;
                __ptr_00[uVar7].coeff[uVar1] = dVar9;
                __ptr_00[uVar7].index[uVar1] = uVar5 / taps;
              }
              dVar10 = dVar10 + 1.0;
            }
            return __ptr;
          }
          pfVar4 = (float *)calloc(uVar7,4);
          __ptr_01[uVar6] = pfVar4;
          uVar6 = uVar6 + 1;
        } while (pfVar4 != (float *)0x0);
        for (uVar7 = 0; __nmemb != uVar7; uVar7 = uVar7 + 1) {
          free(__ptr_01[uVar7]);
        }
        free(__ptr_01);
      }
LAB_00107a76:
      for (lVar8 = 0; __nmemb_00 * 0x18 != lVar8; lVar8 = lVar8 + 0x18) {
        free(*(void **)((long)&__ptr_00->index + lVar8));
        free(*(void **)((long)&__ptr_00->coeff + lVar8));
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (interpolator *)0x0;
}

Assistant:

static interpolator*
interp_create(unsigned int taps, unsigned int factor, unsigned int channels) {
  int errcode; /* unused */
  interpolator* interp;
  unsigned int j;

  interp = (interpolator*) calloc(1, sizeof(interpolator));
  CHECK_ERROR(!interp, 0, exit);

  interp->taps = taps;
  interp->factor = factor;
  interp->channels = channels;
  interp->delay = (interp->taps + interp->factor - 1) / interp->factor;

  /* Initialize the filter memory
   * One subfilter per interpolation factor. */
  interp->filter =
      (interp_filter*) calloc(interp->factor, sizeof(*interp->filter));
  CHECK_ERROR(!interp->filter, 0, free_interp);

  for (j = 0; j < interp->factor; j++) {
    interp->filter[j].index =
        (unsigned int*) calloc(interp->delay, sizeof(unsigned int));
    interp->filter[j].coeff = (double*) calloc(interp->delay, sizeof(double));
    CHECK_ERROR(!interp->filter[j].index || !interp->filter[j].coeff, 0,
                free_filter_index_coeff);
  }

  /* One delay buffer per channel. */
  interp->z = (float**) calloc(interp->channels, sizeof(float*));
  CHECK_ERROR(!interp->z, 0, free_filter_index_coeff);
  for (j = 0; j < interp->channels; j++) {
    interp->z[j] = (float*) calloc(interp->delay, sizeof(float));
    CHECK_ERROR(!interp->z[j], 0, free_filter_z);
  }

  /* Calculate the filter coefficients */
  for (j = 0; j < interp->taps; j++) {
    /* Calculate sinc */
    double m = (double) j - (double) (interp->taps - 1) / 2.0;
    double c = 1.0;
    if (fabs(m) > ALMOST_ZERO) {
      c = sin(m * M_PI / interp->factor) / (m * M_PI / interp->factor);
    }
    /* Apply Hanning window */
    c *= 0.5 * (1 - cos(2 * M_PI * j / (interp->taps - 1)));

    if (fabs(c) > ALMOST_ZERO) { /* Ignore any zero coeffs. */
      /* Put the coefficient into the correct subfilter */
      unsigned int f = j % interp->factor;
      unsigned int t = interp->filter[f].count++;
      interp->filter[f].coeff[t] = c;
      interp->filter[f].index[t] = j / interp->factor;
    }
  }
  return interp;

free_filter_z:
  for (j = 0; j < interp->channels; j++) {
    free(interp->z[j]);
  }
  free(interp->z);
free_filter_index_coeff:
  for (j = 0; j < interp->factor; j++) {
    free(interp->filter[j].index);
    free(interp->filter[j].coeff);
  }
  free(interp->filter);
free_interp:
  free(interp);
exit:
  return NULL;
}